

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  int iVar1;
  LY_ERR *pLVar2;
  lyd_node *plVar3;
  lys_node *plVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  lys_node *local_90;
  lys_node *parent;
  int dflt;
  int ret;
  int first_iter;
  int depth;
  int src_depth;
  int i;
  lys_node *sch;
  lys_node *src_snode;
  lyd_node *iter;
  lyd_node *src_merge_start;
  lyd_node *trg_merge_start;
  lyd_node *target;
  lyd_node *node2;
  lyd_node *node;
  ly_ctx *ctx_local;
  lyd_node *plStack_20;
  int options_local;
  lyd_node *src_local;
  lyd_node **trg_local;
  
  iter = (lyd_node *)0x0;
  _src_depth = (lys_node *)0x0;
  parent._0_4_ = 1;
  pLVar2 = ly_errno_location();
  *pLVar2 = LY_SUCCESS;
  if (((trg == (lyd_node **)0x0) || (*trg == (lyd_node *)0x0)) || (src == (lyd_node *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    return -1;
  }
  trg_merge_start = *trg;
  local_90 = lys_parent(trg_merge_start->schema);
  while( true ) {
    bVar6 = false;
    if (local_90 != (lys_node *)0x0) {
      bVar6 = local_90->nodetype == LYS_USES;
    }
    if (!bVar6) break;
    local_90 = lys_parent(local_90);
  }
  if (local_90 != (lys_node *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ly_log(LY_LLERR,"Target not a top-level data tree.");
    return -1;
  }
  node = (lyd_node *)ctx;
  if ((ctx == (ly_ctx *)0x0) || (trg_merge_start->schema->module->ctx == ctx)) {
    if (src->schema->module->ctx == trg_merge_start->schema->module->ctx) {
      if (ctx == src->schema->module->ctx) {
        node = (lyd_node *)0x0;
      }
    }
    else {
      node = (lyd_node *)trg_merge_start->schema->module->ctx;
    }
  }
  else {
    while (trg_merge_start->prev->next != (lyd_node *)0x0) {
      trg_merge_start = trg_merge_start->prev;
    }
    *trg = trg_merge_start;
    node2 = (lyd_node *)0x0;
    for (; trg_merge_start != (lyd_node *)0x0; trg_merge_start = trg_merge_start->next) {
      plVar3 = lyd_dup_to_ctx(trg_merge_start,1,ctx);
      if ((plVar3 == (lyd_node *)0x0) ||
         ((node2 != (lyd_node *)0x0 &&
          (iVar1 = lyd_insert_after(node2->prev,plVar3), plVar3 = node2, iVar1 != 0))))
      goto LAB_001895c2;
      node2 = plVar3;
    }
    trg_merge_start = node2;
  }
  node2 = (lyd_node *)0x0;
  sch = src->schema;
  first_iter = 0;
  while (plVar4 = lys_parent(sch), plVar4 != (lys_node *)0x0) {
    sch = lys_parent(sch);
    first_iter = first_iter + 1;
  }
  src_merge_start = trg_merge_start;
  ret = 0;
  bVar6 = true;
  plVar3 = iter;
  if (first_iter != 0) {
    src_snode = (lys_node *)src;
    if ((options & 0x1000U) == 0) {
      for (; src_snode != (lys_node *)0x0; src_snode = *(lys_node **)&src_snode->flags) {
        if (((ulong)src_snode->dsc & 0x100) == 0) {
          parent._0_4_ = 0;
          break;
        }
      }
    }
    else {
      parent._0_4_ = (uint)(src->field_0x9 & 1);
    }
  }
  do {
    do {
      iter = plVar3;
      sch = src->schema;
      for (depth = 0; depth < first_iter - ret; depth = depth + 1) {
        sch = lys_parent(sch);
      }
      ret = ret + 1;
      bVar7 = false;
      if (sch != src->schema) {
        bVar7 = (sch->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
      }
      plVar3 = iter;
    } while (bVar7);
    if (sch == src->schema) {
      if ((options & 0x400U) == 0) {
        node2 = (lyd_node *)0x0;
        plStack_20 = src;
        goto LAB_0018944a;
      }
      node2 = src;
      if ((src->prev != src) && ((options & 0x1000U) != 0)) {
        plVar3 = src->prev;
        lyd_unlink(src);
        lyd_free_withsiblings(plVar3);
      }
      goto LAB_001894d9;
    }
    if (sch->nodetype != LYS_CONTAINER) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINVAL;
      pcVar5 = strnodetype(sch->nodetype);
      ly_log(LY_LLERR,"Cannot create %s \"%s\" for the merge.",pcVar5,sch->name);
      break;
    }
    if (iter == (lyd_node *)0x0) {
      if (bVar6) {
        node2 = src_merge_start;
        bVar6 = false;
      }
      else {
        node2 = src_merge_start->child;
      }
      for (; node2 != (lyd_node *)0x0; node2 = node2->next) {
        if (node == (lyd_node *)0x0) {
          _src_depth = sch;
        }
        else {
          _src_depth = lys_get_schema_inctx(sch,(ly_ctx *)node);
          if (_src_depth == (lys_node *)0x0) {
            pLVar2 = ly_errno_location();
            *pLVar2 = LY_EINVAL;
            ly_log(LY_LLERR,
                   "Target context does not contain schema node for the data node being merged (%s:%s)."
                   ,sch->module->name,sch->name);
            goto LAB_001895c2;
          }
        }
        if (node2->schema == _src_depth) {
          src_merge_start = node2;
          break;
        }
      }
      if ((options & 0x400U) == 0) {
        sch = _src_depth;
      }
    }
    else if (((node != (lyd_node *)0x0) && ((options & 0x400U) == 0)) &&
            (sch = lys_get_schema_inctx(sch,(ly_ctx *)node), sch == (lys_node *)0x0)) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINVAL;
      ly_log(LY_LLERR,
             "Target context does not contain schema node for the data node being merged (%s:%s).",
             *(undefined8 *)(lRam0000000000000030 + 8),uRam0000000000000000);
      break;
    }
  } while (((node2 != (lyd_node *)0x0) ||
           (plVar3 = _lyd_new((lyd_node *)0x0,sch,(uint)parent), iter == (lyd_node *)0x0)) ||
          (iVar1 = lyd_insert(plVar3,iter), iVar1 == 0));
LAB_001895c2:
  if (*trg != trg_merge_start) {
    lyd_free_withsiblings(trg_merge_start);
  }
  lyd_free_withsiblings(iter);
  return -1;
LAB_0018944a:
  if (plStack_20 == (lyd_node *)0x0) goto LAB_001894d9;
  plVar3 = lyd_dup_to_ctx(plStack_20,1,(ly_ctx *)node);
  if (plVar3 == (lyd_node *)0x0) {
    lyd_free_withsiblings(node2);
    goto LAB_001895c2;
  }
  if ((node2 != (lyd_node *)0x0) &&
     (iVar1 = lyd_insert_after(node2->prev,plVar3), plVar3 = node2, iVar1 != 0)) {
    lyd_free_withsiblings(node2);
    goto LAB_001895c2;
  }
  node2 = plVar3;
  if ((options & 0x1000U) != 0) goto LAB_001894d9;
  plStack_20 = plStack_20->next;
  goto LAB_0018944a;
LAB_001894d9:
  if (iter == (lyd_node *)0x0) {
    iter = node2;
  }
  else {
    for (target = iter; target->child != (lyd_node *)0x0; target = target->child) {
    }
    target->child = node2;
    for (; node2 != (lyd_node *)0x0; node2 = node2->next) {
      node2->parent = target;
    }
  }
  if (bVar6) {
    parent._4_4_ = lyd_merge_siblings(src_merge_start,iter,options);
  }
  else {
    parent._4_4_ = lyd_merge_parent_children(src_merge_start,iter,options);
  }
  if (parent._4_4_ == 0) {
    if (trg_merge_start->schema->nodetype == LYS_RPC) {
      lyd_schema_sort(trg_merge_start,1);
    }
    if (*trg != trg_merge_start) {
      lyd_free_withsiblings(*trg);
      *trg = trg_merge_start;
    }
    return 0;
  }
  goto LAB_001895c2;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    /* initialize errno */
    ly_errno = LY_SUCCESS;

    if (!trg || !(*trg) || !src) {
        ly_errno = LY_EINVAL;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent) {
        LOGERR(LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         lys_parent(src_snode);
         src_snode = lys_parent(src_snode), ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", src_snode->module->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", src_snode->module->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}